

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

void Sbl_ManUpdateMapping(Sbl_Man_t *p)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  Vec_Int_t *pVVar7;
  int iTemp;
  int iObj;
  int b;
  int c;
  int i;
  word CutN2;
  word CutN1;
  word CutI2;
  word CutI1;
  Vec_Int_t *vObj;
  Sbl_Man_t *p_local;
  
  iVar1 = Vec_IntSize(p->vSolBest);
  iVar2 = Vec_IntSize(p->vSolInit);
  if (iVar2 <= iVar1) {
    __assert_fail("Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x218,"void Sbl_ManUpdateMapping(Sbl_Man_t *)");
  }
  for (b = 0; iVar1 = Vec_IntSize(p->vAnds), b < iVar1; b = b + 1) {
    iVar1 = Vec_IntEntry(p->vAnds,b);
    pVVar7 = Vec_WecEntry(p->pGia->vMapping2,iVar1);
    for (iTemp = 0; iVar1 = Vec_IntSize(pVVar7), iTemp < iVar1; iTemp = iTemp + 1) {
      iVar1 = Vec_IntEntry(pVVar7,iTemp);
      Gia_ObjLutRefDecId(p->pGia,iVar1);
    }
    Vec_IntClear(pVVar7);
  }
  b = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vSolBest);
    if (iVar1 <= b) {
      return;
    }
    iVar1 = Vec_IntEntry(p->vSolBest,b);
    wVar3 = Vec_WrdEntry(p->vCutsI1,iVar1);
    wVar4 = Vec_WrdEntry(p->vCutsI2,iVar1);
    wVar5 = Vec_WrdEntry(p->vCutsN1,iVar1);
    wVar6 = Vec_WrdEntry(p->vCutsN2,iVar1);
    iVar1 = Vec_IntEntry(p->vCutsObj,iVar1);
    iVar1 = Vec_IntEntry(p->vAnds,iVar1);
    pVVar7 = Vec_WecEntry(p->pGia->vMapping2,iVar1);
    Vec_IntClear(pVVar7);
    iVar1 = Vec_IntSize(pVVar7);
    if (iVar1 != 0) break;
    for (iTemp = 0; iTemp < 0x40; iTemp = iTemp + 1) {
      if ((wVar3 >> ((byte)iTemp & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vLeaves,iTemp);
        Vec_IntPush(pVVar7,iVar1);
      }
    }
    for (iTemp = 0; iTemp < 0x40; iTemp = iTemp + 1) {
      if ((wVar4 >> ((byte)iTemp & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vLeaves,iTemp + 0x40);
        Vec_IntPush(pVVar7,iVar1);
      }
    }
    for (iTemp = 0; iTemp < 0x40; iTemp = iTemp + 1) {
      if ((wVar5 >> ((byte)iTemp & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vAnds,iTemp);
        Vec_IntPush(pVVar7,iVar1);
      }
    }
    for (iTemp = 0; iTemp < 0x40; iTemp = iTemp + 1) {
      if ((wVar6 >> ((byte)iTemp & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vAnds,iTemp + 0x40);
        Vec_IntPush(pVVar7,iVar1);
      }
    }
    for (iTemp = 0; iVar1 = Vec_IntSize(pVVar7), iTemp < iVar1; iTemp = iTemp + 1) {
      iVar1 = Vec_IntEntry(pVVar7,iTemp);
      Gia_ObjLutRefIncId(p->pGia,iVar1);
    }
    b = b + 1;
  }
  __assert_fail("Vec_IntSize(vObj) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                ,0x22a,"void Sbl_ManUpdateMapping(Sbl_Man_t *)");
}

Assistant:

void Sbl_ManUpdateMapping( Sbl_Man_t * p )
{
//    Gia_Obj_t * pObj;
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj, iTemp; 
    assert( Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        vObj = Vec_WecEntry(p->pGia->vMapping2, iObj);
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
        Vec_IntClear( vObj );
    }
    Vec_IntForEachEntry( p->vSolBest, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj = Vec_IntEntry( p->vCutsObj, c );
        iObj = Vec_IntEntry( p->vAnds, iObj );
        vObj = Vec_WecEntry( p->pGia->vMapping2, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
    }
/*
    // verify
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefDecId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );

    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        if ( p->pGia->pLutRefs[i] )
            printf( "Object %d has %d refs\n", i, p->pGia->pLutRefs[i] );

    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefIncId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
*/
}